

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int Num;
  int Id;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                  ,0x869,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = Vec_IntAlloc(100);
  iVar3 = pGia->nObjs;
  p_00 = Vec_IntAlloc(iVar3);
  p_00->nSize = iVar3;
  iVar11 = 0;
  memset(p_00->pArray,0,(long)iVar3 << 2);
  if (fUseRiDrivers == 0) {
    iVar3 = 0;
    while ((iVar3 < pGia->nRegs &&
           (pGVar4 = Gia_ManCi(pGia,(pGia->vCis->nSize - pGia->nRegs) + iVar3),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      iVar11 = Gia_ObjId(pGia,pGVar4);
      Vec_IntWriteEntry(p_00,iVar11,1);
      iVar3 = iVar3 + 1;
    }
  }
  else {
    while ((iVar11 < pGia->nRegs &&
           (pGVar4 = Gia_ManCo(pGia,(pGia->vCos->nSize - pGia->nRegs) + iVar11),
           pGVar4 != (Gia_Obj_t *)0x0))) {
      iVar3 = Gia_ObjFaninId0p(pGia,pGVar4);
      Vec_IntWriteEntry(p_00,iVar3,1);
      iVar11 = iVar11 + 1;
    }
  }
  uVar7 = 0;
  uVar12 = 0;
  for (lVar9 = 1; uVar5 = (ulong)pGia->nObjs, lVar9 < (long)uVar5; lVar9 = lVar9 + 1) {
    if (((uint)pGia->pReprs[lVar9] & 0xfffffff) == 0) {
      if (pGia->pNexts[lVar9] != 0) {
        __assert_fail("pGia->pNexts[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                      ,0x87b,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
      }
      uVar7 = uVar7 + 1;
      iVar3 = Vec_IntEntry(p_00,(int)lVar9);
      if (iVar3 == 0) {
        pGia->pReprs[lVar9] = (Gia_Rpr_t)((uint)pGia->pReprs[lVar9] | 0xfffffff);
      }
      else {
        uVar12 = uVar12 + 1;
      }
    }
  }
  uVar10 = 1;
  if (fFlopsOnly == 0) {
    for (; (long)uVar10 < (long)(int)uVar5; uVar10 = uVar10 + 1) {
      iVar3 = Gia_ObjIsHead(pGia,(int)uVar10);
      uVar13 = uVar12;
      if (iVar3 != 0) {
        uVar7 = uVar7 - 1;
        uVar13 = uVar12 - 1;
        bVar2 = false;
        uVar5 = uVar10;
        while (iVar3 = (int)uVar5, iVar3 != 0) {
          iVar11 = Vec_IntEntry(p_00,iVar3);
          if (iVar11 != 0) {
            bVar2 = true;
          }
          uVar7 = uVar7 + 1;
          uVar13 = uVar13 + 1;
          uVar12 = uVar12 + 1;
          uVar5 = (ulong)(uint)pGia->pNexts[iVar3];
        }
        if (!bVar2) {
          puVar6 = (uint *)(pGia->pNexts + uVar10);
          uVar5 = uVar10 & 0xffffffff;
          while (iVar3 = (int)uVar5, iVar3 != 0) {
            uVar13 = *puVar6;
            pGia->pReprs[iVar3] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar3] | 0xfffffff);
            piVar1 = pGia->pNexts;
            piVar1[iVar3] = 0;
            puVar6 = (uint *)(piVar1 + (int)uVar13);
            uVar12 = uVar12 - 1;
            uVar5 = (ulong)uVar13;
          }
          iVar3 = Gia_ObjIsHead(pGia,(int)uVar10);
          uVar13 = uVar12;
          if (iVar3 != 0) {
            __assert_fail("!Gia_ObjIsHead(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                          ,0x8be,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
      uVar12 = uVar13;
      uVar5 = (ulong)(uint)pGia->nObjs;
    }
  }
  else {
    for (; (long)uVar10 < (long)(int)uVar5; uVar10 = uVar10 + 1) {
      iVar3 = Gia_ObjIsHead(pGia,(int)uVar10);
      if (iVar3 != 0) {
        p->nSize = 0;
        uVar7 = uVar7 - 1;
        uVar5 = uVar10;
        while (iVar3 = (int)uVar5, iVar3 != 0) {
          iVar11 = Vec_IntEntry(p_00,iVar3);
          if (iVar11 != 0) {
            Vec_IntPush(p,iVar3);
          }
          uVar7 = uVar7 + 1;
          uVar5 = (ulong)(uint)pGia->pNexts[iVar3];
        }
        puVar6 = (uint *)(pGia->pNexts + uVar10);
        uVar5 = uVar10 & 0xffffffff;
        while (iVar3 = (int)uVar5, iVar3 != 0) {
          uVar13 = *puVar6;
          pGia->pReprs[iVar3] = (Gia_Rpr_t)((uint)pGia->pReprs[iVar3] | 0xfffffff);
          piVar1 = pGia->pNexts;
          piVar1[iVar3] = 0;
          puVar6 = (uint *)(piVar1 + (int)uVar13);
          uVar5 = (ulong)uVar13;
        }
        iVar3 = Gia_ObjIsHead(pGia,(int)uVar10);
        if (iVar3 != 0) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                        ,0x895,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar3 = p->nSize;
        if (1 < iVar3) {
          Num = Vec_IntEntry(p,0);
          iVar8 = Num;
          for (iVar11 = 1; iVar3 != iVar11; iVar11 = iVar11 + 1) {
            Id = Vec_IntEntry(p,iVar11);
            Gia_ObjSetRepr(pGia,Id,Num);
            pGia->pNexts[iVar8] = Id;
            iVar8 = Id;
          }
          if (pGia->pNexts[iVar8] != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEquiv.c"
                          ,0x8a1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
          uVar12 = (uVar12 - 1) + iVar3;
        }
      }
      uVar5 = (ulong)(uint)pGia->nObjs;
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar7,(ulong)uVar12);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}